

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  int *piVar1;
  int iVar2;
  InstOp IVar3;
  int iVar4;
  iterator piVar5;
  ostream *poVar6;
  LogMessage local_1e0;
  Inst *local_60;
  Inst *ip;
  iterator piStack_50;
  int id;
  iterator it;
  undefined1 local_38 [8];
  SparseSet q;
  int b;
  Prog *this_local;
  
  q.dense_._4_4_ = -1;
  iVar2 = size(this);
  SparseSet::SparseSet((SparseSet *)local_38,iVar2);
  iVar2 = start(this);
  SparseSet::insert((SparseSet *)local_38,iVar2);
  piStack_50 = SparseSet::begin((SparseSet *)local_38);
  do {
    piVar1 = piStack_50;
    piVar5 = SparseSet::end((SparseSet *)local_38);
    if (piVar1 == piVar5) {
      this_local._4_4_ = q.dense_._4_4_;
LAB_00170a0c:
      SparseSet::~SparseSet((SparseSet *)local_38);
      return this_local._4_4_;
    }
    ip._4_4_ = *piStack_50;
    local_60 = inst(this,ip._4_4_);
    IVar3 = Inst::opcode(local_60);
    switch(IVar3) {
    case kInstAltMatch:
      iVar2 = Inst::last(local_60);
      if (iVar2 != 0) {
        __assert_fail("!ip->last()",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                      0x2b8,"int re2::Prog::ComputeFirstByte()");
      }
      SparseSet::insert((SparseSet *)local_38,ip._4_4_ + 1);
      break;
    case kInstByteRange:
      iVar2 = Inst::last(local_60);
      if (iVar2 == 0) {
        SparseSet::insert((SparseSet *)local_38,ip._4_4_ + 1);
      }
      iVar2 = Inst::lo(local_60);
      iVar4 = Inst::hi(local_60);
      if (iVar2 != iVar4) {
        this_local._4_4_ = -1;
        goto LAB_00170a0c;
      }
      iVar2 = Inst::foldcase(local_60);
      if (((iVar2 != 0) && (iVar2 = Inst::lo(local_60), 0x60 < iVar2)) &&
         (iVar2 = Inst::lo(local_60), iVar2 < 0x7b)) {
        this_local._4_4_ = -1;
        goto LAB_00170a0c;
      }
      iVar2 = q.dense_._4_4_;
      if (q.dense_._4_4_ == -1) {
        q.dense_._4_4_ = Inst::lo(local_60);
      }
      else {
        iVar4 = Inst::lo(local_60);
        if (iVar2 != iVar4) {
          this_local._4_4_ = -1;
          goto LAB_00170a0c;
        }
      }
      break;
    case kInstCapture:
    case kInstEmptyWidth:
    case kInstNop:
      iVar2 = Inst::last(local_60);
      if (iVar2 == 0) {
        SparseSet::insert((SparseSet *)local_38,ip._4_4_ + 1);
      }
      iVar2 = Inst::out(local_60);
      if (iVar2 != 0) {
        iVar2 = Inst::out(local_60);
        SparseSet::insert((SparseSet *)local_38,iVar2);
      }
      break;
    case kInstMatch:
      this_local._4_4_ = -1;
      goto LAB_00170a0c;
    case kInstFail:
      break;
    default:
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x291
                );
      poVar6 = LogMessage::stream(&local_1e0);
      poVar6 = std::operator<<(poVar6,"unhandled ");
      IVar3 = Inst::opcode(local_60);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,IVar3);
      std::operator<<(poVar6," in ComputeFirstByte");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
    }
    piStack_50 = piStack_50 + 1;
  } while( true );
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}